

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::clear
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this)

{
  vector3_base<int> *pvVar1;
  
  if (this->list != (vector3_base<int> *)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  pvVar1 = (vector3_base<int> *)operator_new__(0xc);
  this->list = pvVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}